

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertions.h
# Opt level: O0

void __thiscall
UnitTests::Assert::NotIn<int,std::vector<int,std::allocator<int>>&>
          (Assert *this,int t,vector<int,_std::allocator<int>_> *container)

{
  string local_40 [32];
  vector<int,_std::allocator<int>_> *local_20;
  vector<int,_std::allocator<int>_> *container_local;
  Assert *pAStack_10;
  int t_local;
  Assert *this_local;
  
  local_20 = container;
  container_local._4_4_ = t;
  pAStack_10 = this;
  std::__cxx11::string::string(local_40);
  NotIn<int,std::vector<int,std::allocator<int>>&>
            (this,(string *)local_40,container_local._4_4_,local_20);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void NotIn(T t, Container&& container) const
        {
            NotIn(std::string(), t, std::forward<Container>(container));
        }